

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall Parser::multiplicative_expression(Parser *this)

{
  int iVar1;
  bool bVar2;
  Expr *pEVar3;
  pointer pBVar4;
  pointer pEVar5;
  bool local_4a;
  unique_ptr<BinExpr,_std::default_delete<BinExpr>_> local_40;
  __single_object be;
  unique_ptr<Expr,_std::default_delete<Expr>_> local_20;
  unique_ptr<Expr,_std::default_delete<Expr>_> e;
  Parser *this_local;
  
  e._M_t.super___uniq_ptr_impl<Expr,_std::default_delete<Expr>_>._M_t.
  super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.super__Head_base<0UL,_Expr_*,_false>.
  _M_head_impl = (__uniq_ptr_data<Expr,_std::default_delete<Expr>,_true,_true>)
                 (__uniq_ptr_data<Expr,_std::default_delete<Expr>,_true,_true>)this;
  pEVar3 = primary_expression(this);
  std::unique_ptr<Expr,std::default_delete<Expr>>::unique_ptr<std::default_delete<Expr>,void>
            ((unique_ptr<Expr,std::default_delete<Expr>> *)&local_20,pEVar3);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar2) {
    while( true ) {
      bVar2 = is_punctuator(this,'*');
      local_4a = true;
      if (!bVar2) {
        bVar2 = is_punctuator(this,'/');
        local_4a = true;
        if (!bVar2) {
          local_4a = is_punctuator(this,'%');
        }
      }
      if (local_4a == false) break;
      std::make_unique<BinExpr>();
      iVar1 = this->tok->i;
      pBVar4 = std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::operator->(&local_40);
      pBVar4->op = (char)iVar1;
      pEVar5 = std::unique_ptr<Expr,_std::default_delete<Expr>_>::release(&local_20);
      pBVar4 = std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::operator->(&local_40);
      pBVar4->lhs = pEVar5;
      next_token(this);
      pEVar3 = primary_expression(this);
      pBVar4 = std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::operator->(&local_40);
      pBVar4->rhs = pEVar3;
      pBVar4 = std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::operator->(&local_40);
      if (pBVar4->rhs == (Expr *)0x0) {
        pBVar4 = std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::operator->(&local_40);
        error<char_const(&)[30],char&>
                  (this,(char (*) [30])"expecting expression after %c",&pBVar4->op);
      }
      std::unique_ptr<Expr,std::default_delete<Expr>>::operator=
                ((unique_ptr<Expr,std::default_delete<Expr>> *)&local_20,&local_40);
      std::unique_ptr<BinExpr,_std::default_delete<BinExpr>_>::~unique_ptr(&local_40);
    }
    this_local = (Parser *)std::unique_ptr<Expr,_std::default_delete<Expr>_>::release(&local_20);
  }
  else {
    this_local = (Parser *)0x0;
  }
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr(&local_20);
  return (Expr *)this_local;
}

Assistant:

Expr* Parser::multiplicative_expression()
{
  std::unique_ptr<Expr> e(primary_expression());
  if (!e)
    return nullptr;

  while (is_punctuator('*') ||
         is_punctuator('/') ||
         is_punctuator('%')) {
    auto be = std::make_unique<BinExpr>();
    be->op = tok->i;
    be->lhs = e.release();

    next_token();
    be->rhs = primary_expression();
    if (!be->rhs)
      error("expecting expression after %c", be->op);

    e = std::move(be);
  }

  return e.release();
}